

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void opengv::absolute_pose::modules::upnp_fill_s
               (Vector4d *quaternion,Matrix<double,_10,_1,_0,_10,_1> *s)

{
  double dVar1;
  double dVar2;
  CoeffReturnType pdVar3;
  Scalar *pSVar4;
  Index in_stack_ffffffffffffff48;
  DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0> *in_stack_ffffffffffffff50;
  DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0> *this;
  
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0>::operator[]
                     (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  this = (DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0> *)*pdVar3;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0>::operator[]
                     (this,in_stack_ffffffffffffff48);
  dVar2 = (double)this * *pdVar3;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_10,_1,_0,_10,_1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_10,_1,_0,_10,_1>,_1> *)this,
                      in_stack_ffffffffffffff48);
  *pSVar4 = dVar2;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0>::operator[]
                     (this,in_stack_ffffffffffffff48);
  dVar2 = *pdVar3;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0>::operator[]
                     (this,in_stack_ffffffffffffff48);
  dVar1 = *pdVar3;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_10,_1,_0,_10,_1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_10,_1,_0,_10,_1>,_1> *)this,
                      in_stack_ffffffffffffff48);
  *pSVar4 = dVar2 * dVar1;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0>::operator[]
                     (this,in_stack_ffffffffffffff48);
  dVar2 = *pdVar3;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0>::operator[]
                     (this,in_stack_ffffffffffffff48);
  dVar1 = *pdVar3;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_10,_1,_0,_10,_1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_10,_1,_0,_10,_1>,_1> *)this,
                      in_stack_ffffffffffffff48);
  *pSVar4 = dVar2 * dVar1;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0>::operator[]
                     (this,in_stack_ffffffffffffff48);
  dVar2 = *pdVar3;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0>::operator[]
                     (this,in_stack_ffffffffffffff48);
  dVar1 = *pdVar3;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_10,_1,_0,_10,_1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_10,_1,_0,_10,_1>,_1> *)this,
                      in_stack_ffffffffffffff48);
  *pSVar4 = dVar2 * dVar1;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0>::operator[]
                     (this,in_stack_ffffffffffffff48);
  dVar2 = *pdVar3;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0>::operator[]
                     (this,in_stack_ffffffffffffff48);
  dVar1 = *pdVar3;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_10,_1,_0,_10,_1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_10,_1,_0,_10,_1>,_1> *)this,
                      in_stack_ffffffffffffff48);
  *pSVar4 = dVar2 * dVar1;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0>::operator[]
                     (this,in_stack_ffffffffffffff48);
  dVar2 = *pdVar3;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0>::operator[]
                     (this,in_stack_ffffffffffffff48);
  dVar1 = *pdVar3;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_10,_1,_0,_10,_1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_10,_1,_0,_10,_1>,_1> *)this,
                      in_stack_ffffffffffffff48);
  *pSVar4 = dVar2 * dVar1;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0>::operator[]
                     (this,in_stack_ffffffffffffff48);
  dVar2 = *pdVar3;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0>::operator[]
                     (this,in_stack_ffffffffffffff48);
  dVar1 = *pdVar3;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_10,_1,_0,_10,_1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_10,_1,_0,_10,_1>,_1> *)this,
                      in_stack_ffffffffffffff48);
  *pSVar4 = dVar2 * dVar1;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0>::operator[]
                     (this,in_stack_ffffffffffffff48);
  dVar2 = *pdVar3;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0>::operator[]
                     (this,in_stack_ffffffffffffff48);
  dVar1 = *pdVar3;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_10,_1,_0,_10,_1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_10,_1,_0,_10,_1>,_1> *)this,
                      in_stack_ffffffffffffff48);
  *pSVar4 = dVar2 * dVar1;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0>::operator[]
                     (this,in_stack_ffffffffffffff48);
  dVar2 = *pdVar3;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0>::operator[]
                     (this,in_stack_ffffffffffffff48);
  dVar1 = *pdVar3;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_10,_1,_0,_10,_1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_10,_1,_0,_10,_1>,_1> *)this,
                      in_stack_ffffffffffffff48);
  *pSVar4 = dVar2 * dVar1;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0>::operator[]
                     (this,in_stack_ffffffffffffff48);
  dVar2 = *pdVar3;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0>::operator[]
                     (this,in_stack_ffffffffffffff48);
  dVar1 = *pdVar3;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_10,_1,_0,_10,_1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_10,_1,_0,_10,_1>,_1> *)this,
                      in_stack_ffffffffffffff48);
  *pSVar4 = dVar2 * dVar1;
  return;
}

Assistant:

void
opengv::absolute_pose::modules::upnp_fill_s(
    const Eigen::Vector4d & quaternion,
    Eigen::Matrix<double,10,1> & s )
{
  s[0] = quaternion[0] * quaternion[0];
  s[1] = quaternion[1] * quaternion[1];
  s[2] = quaternion[2] * quaternion[2];
  s[3] = quaternion[3] * quaternion[3];
  s[4] = quaternion[0] * quaternion[1];
  s[5] = quaternion[0] * quaternion[2];
  s[6] = quaternion[0] * quaternion[3];
  s[7] = quaternion[1] * quaternion[2];
  s[8] = quaternion[1] * quaternion[3];
  s[9] = quaternion[2] * quaternion[3];
}